

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O2

pre_order_iterator
htmlcxx2::HTML::
rfindTag<kp::tree<htmlcxx2::HTML::Node,std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>>>::pre_order_iterator>
          (pre_order_iterator it,pre_order_iterator rend,string *tag)

{
  int iVar1;
  undefined4 uVar2;
  tree_node *ptVar3;
  pre_order_iterator pVar4;
  pre_order_iterator local_30;
  
  local_30.super_iterator_base.node = it.super_iterator_base.node;
  uVar2 = rend.super_iterator_base._8_4_;
  local_30.super_iterator_base.skip_current_children_ =
       it.super_iterator_base.skip_current_children_;
  do {
    ptVar3 = rend.super_iterator_base.node;
    if (local_30.super_iterator_base.node == rend.super_iterator_base.node) {
LAB_00156b93:
      pVar4.super_iterator_base._8_4_ = uVar2;
      pVar4.super_iterator_base.node = ptVar3;
      pVar4.super_iterator_base._12_4_ = 0;
      return (pre_order_iterator)pVar4.super_iterator_base;
    }
    if (((local_30.super_iterator_base.node)->data).kind_ == NODE_TAG) {
      iVar1 = impl::icompare<char>
                        (((local_30.super_iterator_base.node)->data).tagName_._M_dataplus._M_p,
                         (tag->_M_dataplus)._M_p);
      if (iVar1 == 0) {
        uVar2 = CONCAT31(rend.super_iterator_base._9_3_,
                         local_30.super_iterator_base.skip_current_children_);
        ptVar3 = local_30.super_iterator_base.node;
        goto LAB_00156b93;
      }
    }
    kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::
    pre_order_iterator::operator--(&local_30);
  } while( true );
}

Assistant:

inline It rfindTag(It it, It rend, const std::string &tag)
{
    while (it != rend)
    {
        if (it->isTag()
                && (impl::icompare(it->tagName().c_str(), tag.c_str()) == 0))
            return it;
        --it;
    }
    return rend;
}